

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connector.cpp
# Opt level: O0

bool MeCab::Connector::compile(char *ifile,char *ofile)

{
  istringstream *piVar1;
  byte bVar2;
  bool bVar3;
  value_type vVar4;
  int iVar5;
  _Ios_Openmode _Var6;
  char *pcVar7;
  size_t sVar8;
  ostream *poVar9;
  void *this;
  long *plVar10;
  reference pvVar11;
  char *in_RSI;
  char *in_RDI;
  ofstream ofs;
  int c;
  size_t r;
  size_t l;
  vector<short,_std::allocator<short>_> matrix;
  unsigned_short rsize;
  unsigned_short lsize;
  scoped_fixed_array<char,_8192> buf;
  char *column [4];
  istream *is;
  istringstream iss;
  ifstream ifs;
  vector<short,_std::allocator<short>_> *in_stack_fffffffffffff7a8;
  scoped_fixed_array<char,_8192> *in_stack_fffffffffffff7b0;
  __normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_> in_stack_fffffffffffff7b8;
  __normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_> in_stack_fffffffffffff7c0;
  size_type in_stack_fffffffffffff7c8;
  vector<short,_std::allocator<short>_> *in_stack_fffffffffffff7d0;
  size_t in_stack_fffffffffffff7d8;
  char **in_stack_fffffffffffff7e0;
  undefined7 in_stack_fffffffffffff7e8;
  undefined1 in_stack_fffffffffffff7ef;
  char *in_stack_fffffffffffff7f0;
  die local_669;
  long local_668 [64];
  byte local_466;
  die local_465;
  int local_464;
  ulong local_460;
  ulong local_458;
  byte local_44e;
  die local_44d;
  undefined4 local_44c;
  short *local_448;
  short *local_440;
  vector<short,_std::allocator<short>_> local_430;
  ushort local_416;
  ushort local_414;
  byte local_412;
  die local_411;
  scoped_fixed_array<char,_8192> local_410;
  char *local_3f8;
  char *local_3f0;
  char *local_3e8;
  istringstream *local_3d8;
  allocator local_3b9;
  string local_3b8 [32];
  istringstream local_398 [384];
  long local_218 [65];
  char *local_10;
  char *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::ifstream::ifstream(local_218,in_RDI,_S_in);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3b8,"1 1\n0 0 0\n",&local_3b9);
  std::__cxx11::istringstream::istringstream(local_398,local_3b8,_S_in);
  std::__cxx11::string::~string(local_3b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
  local_3d8 = (istringstream *)local_218;
  bVar2 = std::ios::operator!((ios *)((long)local_218 + *(long *)(local_218[0] + -0x18)));
  if ((bVar2 & 1) != 0) {
    poVar9 = std::operator<<((ostream *)&std::cerr,local_8);
    poVar9 = std::operator<<(poVar9," is not found. minimum setting is used.");
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    local_3d8 = local_398;
  }
  scoped_fixed_array<char,_8192>::scoped_fixed_array(in_stack_fffffffffffff7b0);
  piVar1 = local_3d8;
  pcVar7 = scoped_fixed_array<char,_8192>::get(&local_410);
  scoped_fixed_array<char,_8192>::size(&local_410);
  std::istream::getline((char *)piVar1,(long)pcVar7);
  local_412 = 0;
  scoped_fixed_array<char,_8192>::get(&local_410);
  sVar8 = tokenize2<char**>(in_stack_fffffffffffff7f0,
                            (char *)CONCAT17(in_stack_fffffffffffff7ef,in_stack_fffffffffffff7e8),
                            in_stack_fffffffffffff7e0,in_stack_fffffffffffff7d8);
  if (sVar8 != 2) {
    die::die(&local_411);
    local_412 = 1;
    poVar9 = std::operator<<((ostream *)&std::cerr,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/connector.cpp"
                            );
    poVar9 = std::operator<<(poVar9,"(");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,0x51);
    poVar9 = std::operator<<(poVar9,") [");
    poVar9 = std::operator<<(poVar9,"tokenize2(buf.get(), \"\\t \", column, 2) == 2");
    poVar9 = std::operator<<(poVar9,"] ");
    poVar9 = std::operator<<(poVar9,"format error: ");
    pcVar7 = scoped_fixed_array<char,_8192>::get(&local_410);
    poVar9 = std::operator<<(poVar9,pcVar7);
    die::operator&(&local_411,poVar9);
  }
  if ((local_412 & 1) != 0) {
    die::~die((die *)0x151499);
  }
  iVar5 = atoi(local_3f8);
  local_414 = (ushort)iVar5;
  iVar5 = atoi(local_3f0);
  local_416 = (ushort)iVar5;
  std::allocator<short>::allocator((allocator<short> *)0x1514f5);
  std::vector<short,_std::allocator<short>_>::vector
            (in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8,
             (allocator_type *)in_stack_fffffffffffff7c0._M_current);
  std::allocator<short>::~allocator((allocator<short> *)0x151521);
  local_440 = (short *)std::vector<short,_std::allocator<short>_>::begin(in_stack_fffffffffffff7a8);
  local_448 = (short *)std::vector<short,_std::allocator<short>_>::end(in_stack_fffffffffffff7a8);
  local_44c = 0;
  std::fill<__gnu_cxx::__normal_iterator<short*,std::vector<short,std::allocator<short>>>,int>
            (in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8,(int *)in_stack_fffffffffffff7b0);
  poVar9 = std::operator<<((ostream *)&std::cout,"reading ");
  poVar9 = std::operator<<(poVar9,local_8);
  poVar9 = std::operator<<(poVar9," ... ");
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_414);
  poVar9 = std::operator<<(poVar9,"x");
  this = (void *)std::ostream::operator<<(poVar9,local_416);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  while( true ) {
    piVar1 = local_3d8;
    pcVar7 = scoped_fixed_array<char,_8192>::get(&local_410);
    scoped_fixed_array<char,_8192>::size(&local_410);
    plVar10 = (long *)std::istream::getline((char *)piVar1,(long)pcVar7);
    bVar3 = std::ios::operator_cast_to_bool((ios *)((long)plVar10 + *(long *)(*plVar10 + -0x18)));
    if (!bVar3) break;
    local_44e = 0;
    scoped_fixed_array<char,_8192>::get(&local_410);
    sVar8 = tokenize2<char**>(in_stack_fffffffffffff7f0,
                              (char *)CONCAT17(in_stack_fffffffffffff7ef,in_stack_fffffffffffff7e8),
                              in_stack_fffffffffffff7e0,in_stack_fffffffffffff7d8);
    if (sVar8 != 3) {
      die::die(&local_44d);
      local_44e = 1;
      poVar9 = std::operator<<((ostream *)&std::cerr,
                               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/connector.cpp"
                              );
      poVar9 = std::operator<<(poVar9,"(");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,0x5d);
      poVar9 = std::operator<<(poVar9,") [");
      poVar9 = std::operator<<(poVar9,"tokenize2(buf.get(), \"\\t \", column, 3) == 3");
      poVar9 = std::operator<<(poVar9,"] ");
      poVar9 = std::operator<<(poVar9,"format error: ");
      pcVar7 = scoped_fixed_array<char,_8192>::get(&local_410);
      poVar9 = std::operator<<(poVar9,pcVar7);
      die::operator&(&local_44d,poVar9);
    }
    if ((local_44e & 1) != 0) {
      die::~die((die *)0x15188b);
    }
    iVar5 = atoi(local_3f8);
    local_458 = (ulong)iVar5;
    iVar5 = atoi(local_3f0);
    local_460 = (ulong)iVar5;
    local_464 = atoi(local_3e8);
    local_466 = 0;
    if ((local_414 <= local_458) || (local_416 <= local_460)) {
      die::die(&local_465);
      local_466 = 1;
      poVar9 = std::operator<<((ostream *)&std::cerr,
                               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/connector.cpp"
                              );
      poVar9 = std::operator<<(poVar9,"(");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,0x62);
      poVar9 = std::operator<<(poVar9,") [");
      poVar9 = std::operator<<(poVar9,"l < lsize && r < rsize");
      poVar9 = std::operator<<(poVar9,"] ");
      poVar9 = std::operator<<(poVar9,"index values are out of range");
      die::operator&(&local_465,poVar9);
    }
    if ((local_466 & 1) != 0) {
      die::~die((die *)0x1519fe);
    }
    progress_bar((char *)in_stack_fffffffffffff7c0._M_current,
                 (size_t)in_stack_fffffffffffff7b8._M_current,(size_t)in_stack_fffffffffffff7b0);
    vVar4 = (value_type)local_464;
    pvVar11 = std::vector<short,_std::allocator<short>_>::operator[]
                        (&local_430,local_458 + local_414 * local_460);
    *pvVar11 = vVar4;
  }
  pcVar7 = local_10;
  _Var6 = std::operator|(_S_bin,_S_out);
  std::ofstream::ofstream(local_668,pcVar7,_Var6);
  bVar3 = std::ios::operator_cast_to_bool
                    ((ios *)((long)local_668 + *(long *)(local_668[0] + -0x18)));
  if (!bVar3) {
    die::die(&local_669);
    poVar9 = std::operator<<((ostream *)&std::cerr,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/connector.cpp"
                            );
    poVar9 = std::operator<<(poVar9,"(");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,0x68);
    poVar9 = std::operator<<(poVar9,") [");
    in_stack_fffffffffffff7c0._M_current = (short *)std::operator<<(poVar9,"ofs");
    poVar9 = std::operator<<((ostream *)in_stack_fffffffffffff7c0._M_current,"] ");
    in_stack_fffffffffffff7b0 =
         (scoped_fixed_array<char,_8192> *)std::operator<<(poVar9,"permission denied: ");
    poVar9 = std::operator<<((ostream *)in_stack_fffffffffffff7b0,local_10);
    die::operator&(&local_669,poVar9);
    die::~die((die *)0x151cc6);
  }
  std::ostream::write((char *)local_668,(long)&local_414);
  std::ostream::write((char *)local_668,(long)&local_416);
  pvVar11 = std::vector<short,_std::allocator<short>_>::operator[](&local_430,0);
  std::ostream::write((char *)local_668,(long)pvVar11);
  std::ofstream::close();
  std::ofstream::~ofstream(local_668);
  std::vector<short,_std::allocator<short>_>::~vector
            ((vector<short,_std::allocator<short>_> *)in_stack_fffffffffffff7c0._M_current);
  scoped_fixed_array<char,_8192>::~scoped_fixed_array(in_stack_fffffffffffff7b0);
  std::__cxx11::istringstream::~istringstream(local_398);
  std::ifstream::~ifstream(local_218);
  return true;
}

Assistant:

bool Connector::compile(const char *ifile, const char *ofile) {
  std::ifstream ifs(WPATH(ifile));
  std::istringstream iss(MATRIX_DEF_DEFAULT);
  std::istream *is = &ifs;

  if (!ifs) {
    std::cerr << ifile
              << " is not found. minimum setting is used." << std::endl;
    is = &iss;
  }


  char *column[4];
  scoped_fixed_array<char, BUF_SIZE> buf;

  is->getline(buf.get(), buf.size());

  CHECK_DIE(tokenize2(buf.get(), "\t ", column, 2) == 2)
      << "format error: " << buf.get();

  const unsigned short lsize = std::atoi(column[0]);
  const unsigned short rsize = std::atoi(column[1]);
  std::vector<short> matrix(lsize * rsize);
  std::fill(matrix.begin(), matrix.end(), 0);

  std::cout << "reading " << ifile << " ... "
            << lsize << "x" << rsize << std::endl;

  while (is->getline(buf.get(), buf.size())) {
    CHECK_DIE(tokenize2(buf.get(), "\t ", column, 3) == 3)
        << "format error: " << buf.get();
    const size_t l = std::atoi(column[0]);
    const size_t r = std::atoi(column[1]);
    const int    c = std::atoi(column[2]);
    CHECK_DIE(l < lsize && r < rsize) << "index values are out of range";
    progress_bar("emitting matrix      ", l + 1, lsize);
    matrix[(l + lsize * r)] = static_cast<short>(c);
  }

  std::ofstream ofs(WPATH(ofile), std::ios::binary|std::ios::out);
  CHECK_DIE(ofs) << "permission denied: " << ofile;
  ofs.write(reinterpret_cast<const char*>(&lsize), sizeof(unsigned short));
  ofs.write(reinterpret_cast<const char*>(&rsize), sizeof(unsigned short));
  ofs.write(reinterpret_cast<const char*>(&matrix[0]),
            lsize * rsize * sizeof(short));
  ofs.close();

  return true;
}